

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetrepaintmanager.cpp
# Opt level: O1

QPlatformTextureList * widgetTexturesFor(QWidget *tlw,QWidget *widget)

{
  QWidgetPrivate *this;
  __uniq_ptr_data<QTLWExtra,_std::default_delete<QTLWExtra>,_true,_true> _Var1;
  undefined8 *puVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  QWidget *pQVar9;
  QPlatformTextureList *pQVar10;
  undefined8 *puVar11;
  QPlatformTextureList *local_38;
  
  this = *(QWidgetPrivate **)&tlw->field_0x8;
  QWidgetPrivate::createTLExtra(this);
  _Var1.super___uniq_ptr_impl<QTLWExtra,_std::default_delete<QTLWExtra>_>._M_t.
  super__Tuple_impl<0UL,_QTLWExtra_*,_std::default_delete<QTLWExtra>_>.
  super__Head_base<0UL,_QTLWExtra_*,_false>._M_head_impl =
       (((this->extra)._M_t.super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>._M_t.
         super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
         super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl)->topextra)._M_t.
       super___uniq_ptr_impl<QTLWExtra,_std::default_delete<QTLWExtra>_>;
  puVar2 = *(undefined8 **)
            ((long)_Var1.super___uniq_ptr_impl<QTLWExtra,_std::default_delete<QTLWExtra>_>._M_t.
                   super__Tuple_impl<0UL,_QTLWExtra_*,_std::default_delete<QTLWExtra>_>.
                   super__Head_base<0UL,_QTLWExtra_*,_false>._M_head_impl + 0xd0);
  for (puVar11 = *(undefined8 **)
                  ((long)_Var1.super___uniq_ptr_impl<QTLWExtra,_std::default_delete<QTLWExtra>_>.
                         _M_t.super__Tuple_impl<0UL,_QTLWExtra_*,_std::default_delete<QTLWExtra>_>.
                         super__Head_base<0UL,_QTLWExtra_*,_false>._M_head_impl + 200);
      bVar4 = puVar11 == puVar2, !bVar4; puVar11 = puVar11 + 1) {
    iVar7 = QPlatformTextureList::count();
    bVar3 = 0 < iVar7;
    if (0 < iVar7) {
      iVar7 = 0;
      do {
        pQVar9 = (QWidget *)QPlatformTextureList::source((int)*puVar11);
        bVar5 = hasPlatformWindow(pQVar9);
        if (bVar5 && pQVar9 == widget) {
LAB_0031ba04:
          local_38 = (QPlatformTextureList *)*puVar11;
          bVar5 = false;
        }
        else {
          bVar6 = hasPlatformWindow(pQVar9);
          bVar5 = true;
          if ((!bVar6) && (pQVar9 = QWidget::nativeParentWidget(pQVar9), pQVar9 == widget))
          goto LAB_0031ba04;
        }
        if (!bVar5) break;
        iVar7 = iVar7 + 1;
        iVar8 = QPlatformTextureList::count();
        bVar3 = iVar7 < iVar8;
      } while (iVar7 < iVar8);
    }
    if (bVar3) break;
  }
  if (bVar4) {
    if (((*(byte *)(*(long *)&widget->field_0x8 + 0x253) & 2) != 0) &&
       (-2 < (char)QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qt_dummy_platformTextureList>
                   ::guard._q_value.super___atomic_base<signed_char>._M_i)) {
      pQVar10 = (QPlatformTextureList *)
                QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qt_dummy_platformTextureList>_>
                ::instance();
      return pQVar10;
    }
    local_38 = (QPlatformTextureList *)0x0;
  }
  return local_38;
}

Assistant:

static QPlatformTextureList *widgetTexturesFor(QWidget *tlw, QWidget *widget)
{
    for (const auto &tl : QWidgetPrivate::get(tlw)->topData()->widgetTextures) {
        Q_ASSERT(!tl->isEmpty());
        for (int i = 0; i < tl->count(); ++i) {
            QWidget *w = static_cast<QWidget *>(tl->source(i));
            if ((hasPlatformWindow(w) && w == widget) || (!hasPlatformWindow(w) && w->nativeParentWidget() == widget))
                return tl.get();
        }
    }

    if (QWidgetPrivate::get(widget)->textureChildSeen)
        return qt_dummy_platformTextureList();

    return nullptr;
}